

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::getPreviousStart
          (TimeArrayTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  UDate UVar1;
  UDate time;
  int32_t i;
  UDate *result_local;
  UBool inclusive_local;
  int32_t prevDSTSavings_local;
  int32_t prevRawOffset_local;
  UDate base_local;
  TimeArrayTimeZoneRule *this_local;
  
  time._4_4_ = this->fNumStartTimes;
  do {
    do {
      time._4_4_ = time._4_4_ + -1;
      if (time._4_4_ < 0) {
        return '\0';
      }
      UVar1 = getUTC(this,this->fStartTimes[time._4_4_],prevRawOffset,prevDSTSavings);
      if (UVar1 < base) goto LAB_002544fc;
    } while (inclusive == '\0');
  } while ((UVar1 != base) || (NAN(UVar1) || NAN(base)));
LAB_002544fc:
  *result = UVar1;
  return '\x01';
}

Assistant:

UBool
TimeArrayTimeZoneRule::getPreviousStart(UDate base,
                                        int32_t prevRawOffset,
                                        int32_t prevDSTSavings,
                                        UBool inclusive,
                                        UDate& result) const {
    int32_t i = fNumStartTimes - 1;
    for (; i >= 0; i--) {
        UDate time = getUTC(fStartTimes[i], prevRawOffset, prevDSTSavings);
        if (time < base || (inclusive && time == base)) {
            result = time;
            return TRUE;
        }
    }
    return FALSE;
}